

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void nn_sha1_add(nn_sha1 *self,uint8_t data)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint8_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  
  uVar2._0_1_ = self->buffer_offset;
  uVar2._1_1_ = self->is_little_endian;
  uVar2._2_2_ = *(undefined2 *)&self->field_0x5a;
  uVar7 = (uint)((undefined1)uVar2 ^ 3);
  if (self->is_little_endian == '\0') {
    uVar7 = uVar2;
  }
  *(uint8_t *)((long)self->buffer + (ulong)(uVar7 & 0xff)) = data;
  uVar6 = self->buffer_offset + '\x01';
  self->buffer_offset = uVar6;
  if (uVar6 == '@') {
    uVar1 = self->state[0];
    uVar2 = self->state[1];
    uVar7 = self->state[2];
    uVar3 = self->state[3];
    uVar4 = self->state[4];
    uVar5 = uVar1;
    uVar9 = uVar2;
    uVar14 = uVar7;
    uVar8 = uVar3;
    uVar10 = uVar4;
    for (uVar15 = 0; uVar11 = uVar8, uVar8 = uVar14, uVar16 = uVar5, uVar14 = (uint)uVar15,
        uVar14 != 0x50; uVar15 = uVar15 + 1) {
      uVar17 = uVar15;
      if (uVar14 < 0x10) {
LAB_00128d1b:
        iVar12 = ((uVar11 ^ uVar8) & uVar9 ^ uVar11) + 0x5a827999;
      }
      else {
        uVar17 = (ulong)(uVar14 & 0xf);
        uVar13 = self->buffer[uVar14 & 0xf ^ 8] ^ self->buffer[uVar14 + 0xd & 0xf] ^
                 self->buffer[uVar14 + 2 & 0xf] ^ self->buffer[uVar17];
        self->buffer[uVar17] = uVar13 << 1 | (uint)((int)uVar13 < 0);
        if (uVar14 < 0x14) goto LAB_00128d1b;
        if (uVar14 < 0x28) {
          iVar12 = (uVar11 ^ uVar8 ^ uVar9) + 0x6ed9eba1;
        }
        else if (uVar14 < 0x3c) {
          iVar12 = ((uVar8 | uVar9) & uVar11 | uVar8 & uVar9) + 0x8f1bbcdc;
        }
        else {
          iVar12 = (uVar11 ^ uVar8 ^ uVar9) + 0xca62c1d6;
        }
      }
      uVar14 = uVar9 << 0x1e;
      uVar13 = uVar9 >> 2;
      uVar5 = uVar10 + (uVar16 << 5 | uVar16 >> 0x1b) + iVar12 + self->buffer[uVar17];
      uVar9 = uVar16;
      uVar14 = uVar14 | uVar13;
      uVar10 = uVar11;
    }
    self->state[0] = uVar16 + uVar1;
    self->state[1] = uVar9 + uVar2;
    self->state[2] = uVar8 + uVar7;
    self->state[3] = uVar11 + uVar3;
    self->state[4] = uVar10 + uVar4;
    self->buffer_offset = '\0';
  }
  return;
}

Assistant:

static void nn_sha1_add (struct nn_sha1 *self, uint8_t data)
{
    uint8_t i;
    uint32_t a, b, c, d, e, t;
    uint8_t * const buf = (uint8_t*) self->buffer;

    if (self->is_little_endian)
        buf [self->buffer_offset ^ 3] = data;
    else
        buf [self->buffer_offset] = data;

    self->buffer_offset++;
    if (self->buffer_offset == SHA1_BLOCK_LEN) {
        a = self->state [0];
        b = self->state [1];
        c = self->state [2];
        d = self->state [3];
        e = self->state [4];
        for (i = 0; i < 80; i++) {
            if (i >= 16) {
                t = self->buffer [(i + 13) & 15] ^
                    self->buffer [(i + 8) & 15] ^
                    self->buffer [(i + 2) & 15] ^
                    self->buffer [i & 15];
                self->buffer [i & 15] = sha1_rol32 (t, 1);
            }

            if (i < 20)
                t = (d ^ (b & (c ^ d))) + 0x5A827999;
            else if (i < 40)
                t = (b ^ c ^ d) + 0x6ED9EBA1;
            else if (i < 60)
                t = ((b & c) | (d & (b | c))) + 0x8F1BBCDC;
            else
                t = (b ^ c ^ d) + 0xCA62C1D6;

            t += sha1_rol32 (a, 5) + e + self->buffer [i & 15];
            e = d;
            d = c;
            c = sha1_rol32 (b, 30);
            b = a;
            a = t;
        }

        self->state [0] += a;
        self->state [1] += b;
        self->state [2] += c;
        self->state [3] += d;
        self->state [4] += e;

        self->buffer_offset = 0;
    }
}